

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void us_socket_shutdown(int ssl,us_socket_t *s)

{
  us_loop_t *loop;
  int iVar1;
  uint uVar2;
  
  if (ssl != 0) {
    us_internal_ssl_socket_shutdown((us_internal_ssl_socket_t *)s);
    return;
  }
  if ((us_socket_context_t *)s->prev != s->context) {
    iVar1 = us_internal_poll_type(&s->p);
    if (iVar1 != 1) {
      us_internal_poll_set_type(&s->p,1);
      loop = s->context->loop;
      uVar2 = us_poll_events(&s->p);
      us_poll_change(&s->p,loop,uVar2 & 1);
      iVar1 = us_poll_fd(&s->p);
      shutdown(iVar1,1);
      return;
    }
  }
  return;
}

Assistant:

void us_socket_shutdown(int ssl, struct us_socket_t *s) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        us_internal_ssl_socket_shutdown((struct us_internal_ssl_socket_t *) s);
        return;
    }
#endif

    /* Todo: should we emit on_close if calling shutdown on an already half-closed socket?
     * We need more states in that case, we need to track RECEIVED_FIN
     * so far, the app has to track this and call close as needed */
    if (!us_socket_is_closed(ssl, s) && !us_socket_is_shut_down(ssl, s)) {
        us_internal_poll_set_type(&s->p, POLL_TYPE_SOCKET_SHUT_DOWN);
        us_poll_change(&s->p, s->context->loop, us_poll_events(&s->p) & LIBUS_SOCKET_READABLE);
        bsd_shutdown_socket(us_poll_fd((struct us_poll_t *) s));
    }
}